

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
CustomUintFormatter<2,true>::
Unser<ParamsStream<ParamsStream<AutoFile&,CAddress::SerParams>&,CNetAddr::SerParams>,unsigned_short>
          (CustomUintFormatter<2,true> *this,
          ParamsStream<ParamsStream<AutoFile_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *s,
          unsigned_short *v)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t raw;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  raw = 0;
  ParamsStream<ParamsStream<AutoFile_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>::read
            (s,(int)&raw + 6,(void *)0x2,in_RCX);
  *v = (ushort)(byte)(raw >> 0x38) | (ushort)(raw >> 0x28) & 0xff00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        using U = typename std::conditional<std::is_enum<I>::value, std::underlying_type<I>, std::common_type<I>>::type::type;
        static_assert(std::numeric_limits<U>::max() >= MAX && std::numeric_limits<U>::min() <= 0, "Assigned type too small");
        uint64_t raw = 0;
        if (BigEndian) {
            s.read(AsWritableBytes(Span{&raw, 1}).last(Bytes));
            v = static_cast<I>(be64toh_internal(raw));
        } else {
            s.read(AsWritableBytes(Span{&raw, 1}).first(Bytes));
            v = static_cast<I>(le64toh_internal(raw));
        }
    }